

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::
         write_significand<fmt::v9::appender,char,unsigned_int,fmt::v9::detail::digit_grouping<char>>
                   (appender out,uint significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  char cVar1;
  type tVar2;
  char *pcVar3;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  int in_ECX;
  undefined8 in_RDI;
  digit_grouping<char> *in_R9;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  digit_grouping<char> *in_stack_000005b0;
  basic_string_view<char> in_stack_000005b8;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_stack_000005c8;
  buffer<char> *in_stack_fffffffffffffd28;
  buffer<char> *this_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_stack_fffffffffffffd48;
  basic_string_view<char> local_288;
  undefined8 local_278;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_270;
  allocator<char> local_249;
  buffer<char> local_248 [16];
  undefined8 local_30;
  int local_1c;
  undefined8 local_10;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_8;
  
  local_1c = in_ECX;
  local_10 = in_RDI;
  cVar1 = digit_grouping<char>::separator(in_R9);
  if (cVar1 == '\0') {
    local_30 = local_10;
    local_8.container =
         (buffer<char> *)
         write_significand<fmt::v9::appender,_unsigned_int,_char,_0>
                   (in_stack_fffffffffffffd48.container,
                    (uint)((ulong)in_stack_fffffffffffffd40 >> 0x20),(int)in_stack_fffffffffffffd40,
                    (int)((ulong)in_stack_fffffffffffffd38.container >> 0x20),
                    (char)((ulong)in_stack_fffffffffffffd38.container >> 0x18));
  }
  else {
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffd30,(allocator<char> *)in_stack_fffffffffffffd28);
    std::allocator<char>::~allocator(&local_249);
    appender::back_insert_iterator((appender *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    local_270.container =
         (buffer<char> *)
         write_significand<fmt::v9::appender,_unsigned_int,_char,_0>
                   (in_stack_fffffffffffffd48.container,
                    (uint)((ulong)in_stack_fffffffffffffd40 >> 0x20),(int)in_stack_fffffffffffffd40,
                    (int)((ulong)in_stack_fffffffffffffd38.container >> 0x20),
                    (char)((ulong)in_stack_fffffffffffffd38.container >> 0x18));
    local_278 = local_10;
    pcVar3 = buffer<char>::data(local_248);
    tVar2 = to_unsigned<int>(0);
    basic_string_view<char>::basic_string_view(&local_288,pcVar3,(ulong)tVar2);
    digit_grouping<char>::apply<fmt::v9::appender,char>
              (in_stack_000005b0,(appender)in_stack_000005c8.container,in_stack_000005b8);
    this_00 = local_248;
    pcVar3 = buffer<char>::data(this_00);
    this = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)(pcVar3 + local_1c);
    buffer<char>::end(this_00);
    local_8.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v9::appender>
                   ((char *)this,this_00,in_stack_fffffffffffffd38.container);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_8.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}